

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O3

void __thiscall QLineEditPrivate::selectionChanged(QLineEditPrivate *this)

{
  QWidget *this_00;
  QWidgetLineControl *pQVar1;
  QWidget *pQVar2;
  int iVar3;
  QStyle *pQVar4;
  long in_FS_OFFSET;
  bool visible;
  QStyleOptionFrame opt;
  undefined1 local_78 [8];
  undefined8 uStack_70;
  QWidget *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  QTextLayout::preeditAreaText();
  pQVar2 = local_68;
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  if (pQVar2 == (QWidget *)0x0) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
    uStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    uStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)local_78);
    (**(code **)(*(long *)this_00 + 0x1a0))(this_00,local_78);
    pQVar1 = this->control;
    if (((pQVar1->m_text).d.size == 0) || (pQVar1->m_selend <= pQVar1->m_selstart)) {
      visible = QWidget::hasFocus(this_00);
    }
    else {
      pQVar4 = QWidget::style(this_00);
      iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x1c,local_78,this_00,0);
      visible = iVar3 != 0;
    }
    setCursorVisible(this,visible);
    QStyleOption::~QStyleOption((QStyleOption *)local_78);
  }
  QLineEdit::selectionChanged((QLineEdit *)this_00);
  pQVar1 = this->control;
  local_58._4_4_ = pQVar1->m_selend;
  local_58._0_4_ = pQVar1->m_selstart;
  if ((pQVar1->m_text).d.size == 0 || pQVar1->m_selend <= pQVar1->m_selstart) {
    local_58._4_4_ = -1;
    local_58._0_4_ = -1;
  }
  local_78 = (undefined1  [8])QPixmap::load;
  uStack_70._0_4_ = (QFlagsStorageHelper<QStyle::StateFlag,_4>)0x121;
  uStack_70._4_4_ = 0xaaaaaaaa;
  uStack_60._4_4_ = pQVar1->m_cursor;
  uStack_60._0_4_ = -1;
  local_68 = this_00;
  QAccessible::updateAccessibility((QAccessibleEvent *)local_78);
  QAccessibleTextSelectionEvent::~QAccessibleTextSelectionEvent
            ((QAccessibleTextSelectionEvent *)local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLineEditPrivate::selectionChanged()
{
    Q_Q(QLineEdit);
    if (control->preeditAreaText().isEmpty()) {
        QStyleOptionFrame opt;
        q->initStyleOption(&opt);
        bool showCursor = control->hasSelectedText() ?
                          q->style()->styleHint(QStyle::SH_BlinkCursorWhenTextSelected, &opt, q):
                          q->hasFocus();
        setCursorVisible(showCursor);
    }

    emit q->selectionChanged();
#if QT_CONFIG(accessibility)
    QAccessibleTextSelectionEvent ev(q, control->selectionStart(), control->selectionEnd());
    ev.setCursorPosition(control->cursorPosition());
    QAccessible::updateAccessibility(&ev);
#endif
}